

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNBin::gen_binary(CTPNBin *this,uchar opc,int discard,int for_condition)

{
  undefined4 in_ECX;
  int in_EDX;
  long in_RDI;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  
  (**(code **)**(undefined8 **)(in_RDI + 8))(*(undefined8 **)(in_RDI + 8),in_EDX,in_ECX);
  (**(code **)**(undefined8 **)(in_RDI + 0x10))(*(undefined8 **)(in_RDI + 0x10),in_EDX,in_ECX);
  if (in_EDX == 0) {
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    CTcGenTarg::note_pop((CTcGenTarg *)0x27e5a3);
  }
  return;
}

Assistant:

void CTPNBin::gen_binary(uchar opc, int discard, int for_condition)
{
    /* 
     *   generate the operands, passing through the discard and
     *   conditional status 
     */
    left_->gen_code(discard, for_condition);
    right_->gen_code(discard, for_condition);

    /* generate our operand if we're not discarding the result */
    if (!discard)
    {
        /* apply the operator */
        G_cg->write_op(opc);

        /* 
         *   binary operators all remove two values and push one, so there's
         *   a net pop 
         */
        G_cg->note_pop();
    }
}